

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npy.h
# Opt level: O3

string * npy::pyparse::write_tuple<unsigned_long>
                   (string *__return_storage_ptr__,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  pointer __value;
  string delimiter;
  ostringstream ss;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_1d8;
  char *local_1c8 [2];
  char local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    if ((long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start == 8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",)",2);
    }
    else {
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,", ","");
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
      __value = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_1d8._M_string = local_1c8[0];
      lVar2 = (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish + (-8 - (long)__value) >> 3;
      local_1d8._M_stream = (ostream *)local_1a8;
      if (0 < lVar2) {
        uVar3 = lVar2 + 1;
        do {
          std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::operator=
                    (&local_1d8,__value);
          __value = __value + 1;
          uVar3 = uVar3 - 1;
        } while (1 < uVar3);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0]);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string write_tuple(const std::vector<T> &v)
{
    if (v.size() == 0)
        return "";

    std::ostringstream ss;

    if (v.size() == 1)
    {
        ss << "(" << v.front() << ",)";
    }
    else
    {
        const std::string delimiter = ", ";
        // v.size() > 1
        ss << "(";
        std::copy(v.begin(), v.end() - 1, std::ostream_iterator<T>(ss, delimiter.c_str()));
        ss << v.back();
        ss << ")";
    }

    return ss.str();
}